

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O3

imgviz * __thiscall
imgviz::tile(imgviz *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *images,Vec2i *shape,
            uint border_width,Scalar *border_color)

{
  ulong uVar1;
  int iVar2;
  pointer pMVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  Mat *dst;
  Mat image;
  Mat dst_row;
  Mat border;
  uint local_2fc;
  uint local_2f8;
  _InputArray local_2e8;
  long local_2d0;
  long local_2c8;
  _InputArray local_2c0;
  ulong local_2a8;
  Scalar *local_2a0;
  ulong local_298;
  long local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_270;
  _OutputArray local_268;
  _InputArray local_250 [4];
  _InputArray local_1f0 [4];
  undefined1 local_190 [16];
  Size local_180;
  Mat local_120 [96];
  Mat local_c0 [144];
  
  iVar8 = (int)border_color;
  pMVar3 = (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_2f8 = *(uint *)(pMVar3 + 8);
  local_2fc = *(uint *)(pMVar3 + 0xc);
  uVar9 = ((long)(images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar3 >> 5) * -0x5555555555555555;
  if (1 < uVar9) {
    lVar6 = uVar9 - 1;
    pMVar3 = pMVar3 + 0x6c;
    do {
      if (local_2f8 < *(uint *)(pMVar3 + -4)) {
        local_2f8 = *(uint *)(pMVar3 + -4);
      }
      if (local_2fc < *(uint *)pMVar3) {
        local_2fc = *(uint *)pMVar3;
      }
      pMVar3 = pMVar3 + 0x60;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  uVar5 = (shape->super_Matx<int,_2,_1>).val[0];
  uVar7 = (shape->super_Matx<int,_2,_1>).val[1];
  local_2a8 = (ulong)uVar7;
  local_2a0 = border_color;
  local_270 = images;
  if (uVar7 == 0 || uVar5 == 0) {
    dVar10 = round(SQRT((double)(uVar9 & 0xffffffff) / ((double)local_2f8 / (double)local_2fc)));
    iVar2 = (int)(long)dVar10;
    uVar5 = -iVar2;
    local_2a8 = 0xffffffff;
    do {
      uVar7 = (int)local_2a8 + 1;
      local_2a8 = (ulong)uVar7;
      uVar5 = uVar5 + iVar2;
      uVar1 = (long)dVar10;
    } while (uVar5 < (uint)uVar9);
    do {
      uVar4 = uVar1;
      uVar5 = (uint)uVar4;
      uVar1 = (ulong)(uVar5 - 1);
    } while ((uint)uVar9 <= (uVar5 - 1) * uVar7);
    *(ulong *)(shape->super_Matx<int,_2,_1>).val = uVar4 & 0xffffffff | local_2a8 << 0x20;
  }
  cv::Mat::Mat((Mat *)this);
  if (uVar5 != 0) {
    local_280 = (ulong)uVar5;
    local_298 = local_2a8 & 0xffffffff;
    local_288 = local_298 * 0x60;
    local_2c8 = 0;
    local_2d0 = 0;
    local_278 = 0;
    do {
      cv::Mat::Mat((Mat *)local_1f0);
      if ((int)local_2a8 != 0) {
        uVar9 = 0;
        lVar6 = local_2d0;
        do {
          uVar1 = local_2c8 + uVar9;
          local_290 = lVar6;
          cv::Mat::Mat((Mat *)local_250);
          lVar6 = local_290;
          pMVar3 = (local_270->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar1 < (ulong)(((long)(local_270->
                                     super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pMVar3 >> 5) *
                             -0x5555555555555555)) {
            cv::Mat::operator=((Mat *)local_250,pMVar3 + local_290);
            local_2e8.flags = local_2fc;
            local_2e8._4_4_ = local_2f8;
            centerize((imgviz *)local_190,(Mat *)local_250,(Size *)&local_2e8);
            cv::Mat::operator=((Mat *)local_250,(Mat *)local_190);
            cv::Mat::~Mat((Mat *)local_190);
          }
          else {
            cv::Mat::zeros((int)(_InputArray *)local_190,local_2f8,local_2fc);
            (**(code **)(*(long *)CONCAT44(local_190._4_4_,local_190._0_4_) + 0x18))
                      ((long *)CONCAT44(local_190._4_4_,local_190._0_4_),(_InputArray *)local_190,
                       local_250);
            cv::Mat::~Mat(local_c0);
            cv::Mat::~Mat(local_120);
            cv::Mat::~Mat((Mat *)(local_190 + 0x10));
            lVar6 = local_290;
          }
          if ((local_250[0].flags & 0xfffU) == 0) {
            local_180.width = 0;
            local_180.height = 0;
            local_190._0_4_ = 0x1010000;
            local_2e8.sz.width = 0;
            local_2e8.sz.height = 0;
            local_2e8.flags = 0x2010000;
            local_2e8.obj = local_250;
            local_190._8_8_ = local_250;
            cv::cvtColor((cv *)local_190,&local_2e8,(_OutputArray *)0x8,0,iVar8);
          }
          if ((local_250[0].flags & 0xfffU) != 0x10) {
            __assert_fail("image.type() == CV_8UC3",
                          "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                          ,0xa8,
                          "cv::Mat imgviz::tile(const std::vector<cv::Mat>, cv::Vec2i, const unsigned int, const cv::Scalar)"
                         );
          }
          if (uVar9 == 0) {
            cv::Mat::operator=((Mat *)local_1f0,(Mat *)local_250);
          }
          else {
            if (border_width != 0) {
              cv::Mat::Mat((Mat *)local_190,(int)local_1f0[0].obj,border_width,0x10);
              local_2e8.flags = -0x3efdfffa;
              local_2e8.obj = local_2a0;
              local_2e8.sz.width = 1;
              local_2e8.sz.height = 4;
              cv::noArray();
              cv::Mat::setTo((_InputArray *)local_190,&local_2e8);
              local_2e8.sz.width = 0;
              local_2e8.sz.height = 0;
              local_2e8.flags = 0x1010000;
              local_2c0.sz.width = 0;
              local_2c0.sz.height = 0;
              local_2c0.flags = 0x1010000;
              local_268.super__InputArray.sz.width = 0;
              local_268.super__InputArray.sz.height = 0;
              local_268.super__InputArray.flags = 0x2010000;
              local_2e8.obj = local_1f0;
              local_2c0.obj = (_InputArray *)local_190;
              local_268.super__InputArray.obj = local_1f0;
              cv::hconcat(&local_2e8,&local_2c0,&local_268);
              cv::Mat::~Mat((Mat *)local_190);
            }
            local_180.width = 0;
            local_180.height = 0;
            local_190._0_4_ = 0x1010000;
            local_2e8.sz.width = 0;
            local_2e8.sz.height = 0;
            local_2e8.flags = 0x1010000;
            local_2c0.sz.width = 0;
            local_2c0.sz.height = 0;
            local_2c0.flags = 0x2010000;
            local_2e8.obj = local_250;
            local_2c0.obj = local_1f0;
            local_190._8_8_ = local_1f0;
            cv::hconcat((_InputArray *)local_190,&local_2e8,(_OutputArray *)&local_2c0);
          }
          cv::Mat::~Mat((Mat *)local_250);
          uVar9 = uVar9 + 1;
          lVar6 = lVar6 + 0x60;
        } while (local_298 != uVar9);
      }
      uVar9 = local_278;
      if (local_278 == 0) {
        cv::Mat::operator=((Mat *)this,(Mat *)local_1f0);
      }
      else {
        if (border_width != 0) {
          cv::Mat::Mat((Mat *)local_190,border_width,*(int *)(this + 0xc),0x10);
          local_250[0].flags = -0x3efdfffa;
          local_250[0].obj = local_2a0;
          local_250[0].sz.width = 1;
          local_250[0].sz.height = 4;
          cv::noArray();
          cv::Mat::setTo((_InputArray *)local_190,local_250);
          local_250[0].sz.width = 0;
          local_250[0].sz.height = 0;
          local_250[0].flags = 0x1010000;
          local_2e8.sz.width = 0;
          local_2e8.sz.height = 0;
          local_2e8.flags = 0x1010000;
          local_2c0.sz.width = 0;
          local_2c0.sz.height = 0;
          local_2c0.flags = 0x2010000;
          local_2e8.obj = (_InputArray *)local_190;
          local_2c0.obj = this;
          local_250[0].obj = this;
          cv::vconcat(local_250,&local_2e8,(_OutputArray *)&local_2c0);
          cv::Mat::~Mat((Mat *)local_190);
        }
        local_180.width = 0;
        local_180.height = 0;
        local_190._0_4_ = 0x1010000;
        local_250[0].sz.width = 0;
        local_250[0].sz.height = 0;
        local_250[0].flags = 0x1010000;
        local_2e8.sz.width = 0;
        local_2e8.sz.height = 0;
        local_2e8.flags = 0x2010000;
        local_2e8.obj = this;
        local_250[0].obj = local_1f0;
        local_190._8_8_ = this;
        cv::vconcat((_InputArray *)local_190,local_250,(_OutputArray *)&local_2e8);
      }
      cv::Mat::~Mat((Mat *)local_1f0);
      local_278 = uVar9 + 1;
      local_2d0 = local_2d0 + local_288;
      local_2c8 = local_2c8 + local_298;
    } while (local_278 != local_280);
  }
  return this;
}

Assistant:

cv::Mat tile(const std::vector<cv::Mat> images,
             cv::Vec2i shape = cv::Vec2i(0, 0), const unsigned border_width = 5,
             const cv::Scalar border_color = cv::Scalar(255, 255, 255)) {
  unsigned height = images[0].rows;
  unsigned width = images[0].cols;
  for (size_t i = 1; i < images.size(); i++) {
    if (images[i].rows > height) {
      height = images[i].rows;
    }
    if (images[i].cols > width) {
      width = images[i].cols;
    }
  }

  if (shape[0] * shape[1] == 0) {
    shape = getTileShape(/*size=*/images.size(),
                         /*hw_ratio=*/static_cast<double>(height) /
                             static_cast<double>(width));
  }
  unsigned rows = shape[0];
  unsigned cols = shape[1];

  cv::Mat dst;
  for (size_t j = 0; j < rows; j++) {
    cv::Mat dst_row;
    for (size_t i = 0; i < cols; i++) {
      size_t index = j * cols + i;

      cv::Mat image;
      if (index < images.size()) {
        image = images[index];
        image = centerize(image, cv::Size(width, height));
      } else {
        image = cv::Mat::zeros(height, width, images[0].type());
      }

      if (image.type() == CV_8UC1) {
        cv::cvtColor(image, image, cv::COLOR_GRAY2BGR);
      }
      assert(image.type() == CV_8UC3);

      if (i == 0) {
        dst_row = image;
      } else {
        if (border_width != 0) {
          cv::Mat border = cv::Mat(dst_row.rows, border_width, CV_8UC3);
          border.setTo(border_color);
          cv::hconcat(dst_row, border, dst_row);
        }
        cv::hconcat(dst_row, image, dst_row);
      }
    }
    if (j == 0) {
      dst = dst_row;
    } else {
      if (border_width != 0) {
        cv::Mat border = cv::Mat(border_width, dst.cols, CV_8UC3);
        border.setTo(border_color);
        cv::vconcat(dst, border, dst);
      }
      cv::vconcat(dst, dst_row, dst);
    }
  }

  return dst;
}